

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchar.cpp
# Opt level: O1

uint32_t u_getUnicodeProperties_63(UChar32 c,int32_t column)

{
  uint uVar1;
  ulong uVar2;
  
  if (2 < column) {
    return 0;
  }
  if ((uint)c < 0xd800) {
    uVar1 = (uint)c >> 5;
  }
  else if ((uint)c < 0x10000) {
    uVar1 = ((uint)c >> 5) + 0x140;
    if (0xdbff < c) {
      uVar1 = (uint)c >> 5;
    }
  }
  else {
    uVar2 = 0x13d4;
    if (0x10ffff < (uint)c) goto LAB_002ac238;
    uVar1 = ((uint)c >> 5 & 0x3f) + (uint)propsVectorsTrie_index[(ulong)((uint)c >> 0xb) + 0x820];
  }
  uVar2 = (ulong)((c & 0x1fU) + (uint)propsVectorsTrie_index[uVar1] * 4);
LAB_002ac238:
  return propsVectors[(long)column + (ulong)propsVectorsTrie_index[uVar2]];
}

Assistant:

U_CFUNC uint32_t
u_getUnicodeProperties(UChar32 c, int32_t column) {
    U_ASSERT(column>=0);
    if(column>=propsVectorsColumns) {
        return 0;
    } else {
        uint16_t vecIndex=UTRIE2_GET16(&propsVectorsTrie, c);
        return propsVectors[vecIndex+column];
    }
}